

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O0

size_t WebRtc_WriteBuffer(RingBuffer *self,void *data,size_t element_count)

{
  RingBuffer *pRVar1;
  RingBuffer *local_50;
  size_t margin;
  size_t n;
  size_t write_elements;
  size_t free_elements;
  size_t element_count_local;
  void *data_local;
  RingBuffer *self_local;
  
  if (self == (RingBuffer *)0x0) {
    self_local = (RingBuffer *)0x0;
  }
  else if (data == (void *)0x0) {
    self_local = (RingBuffer *)0x0;
  }
  else {
    pRVar1 = (RingBuffer *)WebRtc_available_write(self);
    local_50 = (RingBuffer *)element_count;
    if (pRVar1 < element_count) {
      local_50 = pRVar1;
    }
    margin = (size_t)local_50;
    pRVar1 = (RingBuffer *)(self->element_count - self->write_pos);
    if (pRVar1 < local_50) {
      memcpy(self->data + self->write_pos * self->element_size,data,
             (long)pRVar1 * self->element_size);
      self->write_pos = 0;
      margin = (long)local_50 - (long)pRVar1;
      self->rw_wrap = DIFF_WRAP;
    }
    memcpy(self->data + self->write_pos * self->element_size,
           (void *)((long)data + ((long)local_50 - margin) * self->element_size),
           margin * self->element_size);
    self->write_pos = margin + self->write_pos;
    self_local = local_50;
  }
  return (size_t)self_local;
}

Assistant:

size_t WebRtc_WriteBuffer(RingBuffer* self,
                          const void* data,
                          size_t element_count) {
  if (!self) {
    return 0;
  }
  if (!data) {
    return 0;
  }

  {
    const size_t free_elements = WebRtc_available_write(self);
    const size_t write_elements = (free_elements < element_count ? free_elements
        : element_count);
    size_t n = write_elements;
    const size_t margin = self->element_count - self->write_pos;

    if (write_elements > margin) {
      // Buffer wrap around when writing.
      memcpy(self->data + self->write_pos * self->element_size,
             data, margin * self->element_size);
      self->write_pos = 0;
      n -= margin;
      self->rw_wrap = DIFF_WRAP;
    }
    memcpy(self->data + self->write_pos * self->element_size,
           ((const char*) data) + ((write_elements - n) * self->element_size),
           n * self->element_size);
    self->write_pos += n;

    return write_elements;
  }
}